

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSTEIDeriv1_Writer.cpp
# Opt level: O2

void __thiscall
OSTEIDeriv1_Writer::Write_Permute_(OSTEIDeriv1_Writer *this,QAM *am,bool swap12,bool swap34)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  int iVar6;
  ostream *poVar7;
  uint uVar8;
  undefined7 in_register_00000009;
  undefined7 in_register_00000011;
  QAM *pQVar9;
  char *pcVar10;
  char *pcVar11;
  int iVar12;
  int iVar13;
  allocator local_1d1;
  char vd;
  char vc;
  char vb;
  char va;
  int local_1cc;
  string local_1c8;
  undefined4 local_1a4;
  string local_1a0;
  size_t ncart_abcd;
  undefined1 local_178 [48];
  string idx;
  size_t ncart_cd;
  size_t ncart_bcd;
  size_t ncart_d;
  string fname;
  undefined1 local_f0 [48];
  undefined1 local_c0 [48];
  undefined1 local_90 [48];
  undefined1 local_60 [48];
  
  QAM::QAM((QAM *)local_178,am);
  uVar5 = local_178._12_4_;
  uVar4 = local_178._8_4_;
  local_1cc = (int)CONCAT71(in_register_00000011,swap12);
  local_1a4 = (undefined4)CONCAT71(in_register_00000009,swap34);
  if (local_1cc == 0) {
    if (swap34) goto LAB_00125fb4;
  }
  else {
    iVar12 = (int)local_178._0_8_;
    iVar13 = SUB84(local_178._0_8_,4);
    local_178._4_4_ = iVar12;
    local_178._0_4_ = iVar13;
    if (swap34) {
LAB_00125fb4:
      local_178._8_4_ = local_178._12_4_;
      local_178._12_4_ = uVar4;
      if (uVar5 == uVar4 && !swap12) goto LAB_00126efd;
      if (swap12) {
        if (uVar5 == uVar4 || local_178._0_4_ == local_178._4_4_) goto LAB_00126efd;
      }
    }
    else if ((swap12) && (iVar13 == iVar12)) goto LAB_00126efd;
  }
  poVar7 = (this->super_OSTEI_Writer_Base).os_;
  pQVar9 = (QAM *)local_178;
  QAM::QAM((QAM *)local_60,pQVar9);
  FunctionPrototype__abi_cxx11_(&fname,(OSTEIDeriv1_Writer *)pQVar9,(QAM *)local_60);
  poVar7 = std::operator<<(poVar7,(string *)&fname);
  std::operator<<(poVar7,"\n");
  std::__cxx11::string::~string((string *)&fname);
  std::__cxx11::string::~string((string *)(local_60 + 0x10));
  std::operator<<((this->super_OSTEI_Writer_Base).os_,"{\n");
  if ((char)local_1cc == '\0') {
    pcVar10 = "P";
  }
  else {
    poVar7 = std::operator<<((this->super_OSTEI_Writer_Base).os_,(string *)&indent1_abi_cxx11_);
    std::operator<<(poVar7,"double P_AB[3*P.nshell12];\n");
    poVar7 = std::operator<<((this->super_OSTEI_Writer_Base).os_,(string *)&indent1_abi_cxx11_);
    std::operator<<(poVar7,"struct simint_multi_shellpair P_tmp = P;\n");
    poVar7 = std::operator<<((this->super_OSTEI_Writer_Base).os_,(string *)&indent1_abi_cxx11_);
    std::operator<<(poVar7,"P_tmp.alpha2 = P.beta2;  P_tmp.beta2 = P.alpha2;\n");
    poVar7 = std::operator<<((this->super_OSTEI_Writer_Base).os_,(string *)&indent1_abi_cxx11_);
    std::operator<<(poVar7,"P_tmp.PA_x = P.PB_x;  P_tmp.PA_y = P.PB_y;  P_tmp.PA_z = P.PB_z;\n");
    poVar7 = std::operator<<((this->super_OSTEI_Writer_Base).os_,(string *)&indent1_abi_cxx11_);
    std::operator<<(poVar7,"P_tmp.PB_x = P.PA_x;  P_tmp.PB_y = P.PA_y;  P_tmp.PB_z = P.PA_z;\n");
    poVar7 = std::operator<<((this->super_OSTEI_Writer_Base).os_,(string *)&indent1_abi_cxx11_);
    std::operator<<(poVar7,"P_tmp.AB_x = P_AB;\n");
    poVar7 = std::operator<<((this->super_OSTEI_Writer_Base).os_,(string *)&indent1_abi_cxx11_);
    std::operator<<(poVar7,"P_tmp.AB_y = P_AB + P.nshell12;\n");
    poVar7 = std::operator<<((this->super_OSTEI_Writer_Base).os_,(string *)&indent1_abi_cxx11_);
    std::operator<<(poVar7,"P_tmp.AB_z = P_AB + 2*P.nshell12;\n");
    std::operator<<((this->super_OSTEI_Writer_Base).os_,"\n");
    poVar7 = std::operator<<((this->super_OSTEI_Writer_Base).os_,(string *)&indent1_abi_cxx11_);
    std::operator<<(poVar7,"for(int i = 0; i < P.nshell12; i++)\n");
    poVar7 = std::operator<<((this->super_OSTEI_Writer_Base).os_,(string *)&indent1_abi_cxx11_);
    std::operator<<(poVar7,"{\n");
    poVar7 = std::operator<<((this->super_OSTEI_Writer_Base).os_,(string *)&indent2_abi_cxx11_);
    std::operator<<(poVar7,"P_tmp.AB_x[i] = -P.AB_x[i];\n");
    poVar7 = std::operator<<((this->super_OSTEI_Writer_Base).os_,(string *)&indent2_abi_cxx11_);
    std::operator<<(poVar7,"P_tmp.AB_y[i] = -P.AB_y[i];\n");
    poVar7 = std::operator<<((this->super_OSTEI_Writer_Base).os_,(string *)&indent2_abi_cxx11_);
    std::operator<<(poVar7,"P_tmp.AB_z[i] = -P.AB_z[i];\n");
    poVar7 = std::operator<<((this->super_OSTEI_Writer_Base).os_,(string *)&indent1_abi_cxx11_);
    std::operator<<(poVar7,"}\n\n");
    pcVar10 = "P_tmp";
  }
  if ((char)local_1a4 == '\0') {
    pcVar11 = "Q";
  }
  else {
    poVar7 = std::operator<<((this->super_OSTEI_Writer_Base).os_,(string *)&indent1_abi_cxx11_);
    std::operator<<(poVar7,"double Q_AB[3*Q.nshell12];\n");
    poVar7 = std::operator<<((this->super_OSTEI_Writer_Base).os_,(string *)&indent1_abi_cxx11_);
    std::operator<<(poVar7,"struct simint_multi_shellpair Q_tmp = Q;\n");
    poVar7 = std::operator<<((this->super_OSTEI_Writer_Base).os_,(string *)&indent1_abi_cxx11_);
    std::operator<<(poVar7,"Q_tmp.alpha2 = Q.beta2;  Q_tmp.beta2 = Q.alpha2;\n");
    poVar7 = std::operator<<((this->super_OSTEI_Writer_Base).os_,(string *)&indent1_abi_cxx11_);
    std::operator<<(poVar7,"Q_tmp.PA_x = Q.PB_x;  Q_tmp.PA_y = Q.PB_y;  Q_tmp.PA_z = Q.PB_z;\n");
    poVar7 = std::operator<<((this->super_OSTEI_Writer_Base).os_,(string *)&indent1_abi_cxx11_);
    std::operator<<(poVar7,"Q_tmp.PB_x = Q.PA_x;  Q_tmp.PB_y = Q.PA_y;  Q_tmp.PB_z = Q.PA_z;\n");
    poVar7 = std::operator<<((this->super_OSTEI_Writer_Base).os_,(string *)&indent1_abi_cxx11_);
    std::operator<<(poVar7,"Q_tmp.AB_x = Q_AB;\n");
    poVar7 = std::operator<<((this->super_OSTEI_Writer_Base).os_,(string *)&indent1_abi_cxx11_);
    std::operator<<(poVar7,"Q_tmp.AB_y = Q_AB + Q.nshell12;\n");
    poVar7 = std::operator<<((this->super_OSTEI_Writer_Base).os_,(string *)&indent1_abi_cxx11_);
    std::operator<<(poVar7,"Q_tmp.AB_z = Q_AB + 2*Q.nshell12;\n");
    std::operator<<((this->super_OSTEI_Writer_Base).os_,"\n");
    poVar7 = std::operator<<((this->super_OSTEI_Writer_Base).os_,(string *)&indent1_abi_cxx11_);
    std::operator<<(poVar7,"for(int i = 0; i < Q.nshell12; i++)\n");
    poVar7 = std::operator<<((this->super_OSTEI_Writer_Base).os_,(string *)&indent1_abi_cxx11_);
    std::operator<<(poVar7,"{\n");
    poVar7 = std::operator<<((this->super_OSTEI_Writer_Base).os_,(string *)&indent2_abi_cxx11_);
    std::operator<<(poVar7,"Q_tmp.AB_x[i] = -Q.AB_x[i];\n");
    poVar7 = std::operator<<((this->super_OSTEI_Writer_Base).os_,(string *)&indent2_abi_cxx11_);
    std::operator<<(poVar7,"Q_tmp.AB_y[i] = -Q.AB_y[i];\n");
    poVar7 = std::operator<<((this->super_OSTEI_Writer_Base).os_,(string *)&indent2_abi_cxx11_);
    std::operator<<(poVar7,"Q_tmp.AB_z[i] = -Q.AB_z[i];\n");
    poVar7 = std::operator<<((this->super_OSTEI_Writer_Base).os_,(string *)&indent1_abi_cxx11_);
    std::operator<<(poVar7,"}\n\n");
    pcVar11 = "Q_tmp";
  }
  pQVar9 = am;
  QAM::QAM((QAM *)local_90,am);
  FunctionName__abi_cxx11_(&fname,(OSTEIDeriv1_Writer *)pQVar9,(QAM *)local_90);
  std::__cxx11::string::~string((string *)(local_90 + 0x10));
  poVar7 = std::operator<<((this->super_OSTEI_Writer_Base).os_,(string *)&indent1_abi_cxx11_);
  poVar7 = std::operator<<(poVar7,"int ret = ");
  poVar7 = std::operator<<(poVar7,(string *)&fname);
  poVar7 = std::operator<<(poVar7,"(");
  poVar7 = std::operator<<(poVar7,pcVar10);
  poVar7 = std::operator<<(poVar7,", ");
  poVar7 = std::operator<<(poVar7,pcVar11);
  poVar7 = std::operator<<(poVar7,", screen_tol, ");
  poVar7 = std::operator<<(poVar7,"work, ");
  std::__cxx11::string::string((string *)&local_1c8,"",(allocator *)&local_1a0);
  ArrVarName(&idx,(QAM *)local_178,&local_1c8);
  poVar7 = std::operator<<(poVar7,(string *)&idx);
  std::operator<<(poVar7,");\n");
  std::__cxx11::string::~string((string *)&idx);
  std::__cxx11::string::~string((string *)&local_1c8);
  QAM::QAM((QAM *)local_c0,am);
  iVar6 = NCART((QAM *)local_c0);
  std::__cxx11::string::~string((string *)(local_c0 + 0x10));
  iVar12 = (am->qam)._M_elems[1];
  iVar13 = (am->qam)._M_elems[2];
  uVar8 = 0;
  uVar1 = (uint)((iVar12 + 1) * (iVar12 + 2)) >> 1;
  if (iVar12 < 0) {
    uVar1 = uVar8;
  }
  uVar2 = (uint)((iVar13 + 1) * (iVar13 + 2)) >> 1;
  if (iVar13 < 0) {
    uVar2 = uVar8;
  }
  iVar12 = (am->qam)._M_elems[3];
  uVar3 = (uint)((iVar12 + 1) * (iVar12 + 2)) >> 1;
  if (iVar12 < 0) {
    uVar3 = uVar8;
  }
  ncart_d = (size_t)uVar3;
  ncart_cd = uVar2 * ncart_d;
  ncart_bcd = uVar1 * ncart_cd;
  va = 'a';
  vb = 'b';
  vc = 'c';
  vd = 'd';
  if ((char)local_1cc != '\0') {
    va = 'b';
    vb = 'a';
  }
  if ((char)local_1a4 != '\0') {
    vc = 'd';
    vd = 'c';
  }
  ncart_abcd = (long)iVar6;
  StringBuilder<char[7],unsigned_long&,char_const(&)[2],char&,char_const(&)[2],unsigned_long&,char_const(&)[2],char&,char_const(&)[2],unsigned_long&,char_const(&)[2],char&,char_const(&)[2],unsigned_long&,char_const(&)[2],char&,char_const(&)[2]>
            (&idx,(char (*) [7])"12*(q*",&ncart_abcd,(char (*) [2])"+",&va,(char (*) [2])0x13ca82,
             &ncart_bcd,(char (*) [2])"+",&vb,(char (*) [2])0x13ca82,&ncart_cd,(char (*) [2])"+",&vc
             ,(char (*) [2])0x13ca82,&ncart_d,(char (*) [2])"+",&vd,(char (*) [2])0x13998f);
  poVar7 = std::operator<<((this->super_OSTEI_Writer_Base).os_,(string *)&indent1_abi_cxx11_);
  poVar7 = std::operator<<(poVar7,"double buffer[12*");
  poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
  std::operator<<(poVar7,"] SIMINT_ALIGN_ARRAY_DBL;\n\n");
  poVar7 = std::operator<<((this->super_OSTEI_Writer_Base).os_,(string *)&indent1_abi_cxx11_);
  std::operator<<(poVar7,"for(int q = 0; q < ret; q++)\n");
  poVar7 = std::operator<<((this->super_OSTEI_Writer_Base).os_,(string *)&indent1_abi_cxx11_);
  std::operator<<(poVar7,"{\n");
  poVar7 = std::operator<<((this->super_OSTEI_Writer_Base).os_,(string *)&indent2_abi_cxx11_);
  std::operator<<(poVar7,"int idx = 0;\n");
  poVar7 = std::operator<<((this->super_OSTEI_Writer_Base).os_,(string *)&indent2_abi_cxx11_);
  poVar7 = std::operator<<(poVar7,"for(int a = 0; a < ");
  poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
  std::operator<<(poVar7,"; ++a)\n");
  poVar7 = std::operator<<((this->super_OSTEI_Writer_Base).os_,(string *)&indent2_abi_cxx11_);
  poVar7 = std::operator<<(poVar7,"for(int b = 0; b < ");
  poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
  std::operator<<(poVar7,"; ++b)\n");
  poVar7 = std::operator<<((this->super_OSTEI_Writer_Base).os_,(string *)&indent2_abi_cxx11_);
  poVar7 = std::operator<<(poVar7,"for(int c = 0; c < ");
  poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
  std::operator<<(poVar7,"; ++c)\n");
  poVar7 = std::operator<<((this->super_OSTEI_Writer_Base).os_,(string *)&indent2_abi_cxx11_);
  poVar7 = std::operator<<(poVar7,"for(int d = 0; d < ");
  poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
  std::operator<<(poVar7,"; ++d)\n");
  poVar7 = std::operator<<((this->super_OSTEI_Writer_Base).os_,(string *)&indent2_abi_cxx11_);
  std::operator<<(poVar7,"{\n");
  poVar7 = (this->super_OSTEI_Writer_Base).os_;
  if ((char)local_1cc == '\0') {
    poVar7 = std::operator<<(poVar7,(string *)&indent3_abi_cxx11_);
    poVar7 = std::operator<<(poVar7,"memcpy(buffer + idx + 0, ");
    std::__cxx11::string::string((string *)&local_1a0,"",&local_1d1);
    ArrVarName(&local_1c8,(QAM *)local_178,&local_1a0);
    poVar7 = std::operator<<(poVar7,(string *)&local_1c8);
    poVar7 = std::operator<<(poVar7," + ");
    poVar7 = std::operator<<(poVar7,(string *)&idx);
    std::operator<<(poVar7," + 0, 6*sizeof(double));\n");
  }
  else {
    poVar7 = std::operator<<(poVar7,(string *)&indent3_abi_cxx11_);
    poVar7 = std::operator<<(poVar7,"memcpy(buffer + idx + 0, ");
    std::__cxx11::string::string((string *)&local_1a0,"",&local_1d1);
    ArrVarName(&local_1c8,(QAM *)local_178,&local_1a0);
    poVar7 = std::operator<<(poVar7,(string *)&local_1c8);
    poVar7 = std::operator<<(poVar7," + ");
    poVar7 = std::operator<<(poVar7,(string *)&idx);
    std::operator<<(poVar7," + 3, 3*sizeof(double));\n");
    std::__cxx11::string::~string((string *)&local_1c8);
    std::__cxx11::string::~string((string *)&local_1a0);
    poVar7 = std::operator<<((this->super_OSTEI_Writer_Base).os_,(string *)&indent3_abi_cxx11_);
    poVar7 = std::operator<<(poVar7,"memcpy(buffer + idx + 3, ");
    std::__cxx11::string::string((string *)&local_1a0,"",&local_1d1);
    ArrVarName(&local_1c8,(QAM *)local_178,&local_1a0);
    poVar7 = std::operator<<(poVar7,(string *)&local_1c8);
    poVar7 = std::operator<<(poVar7," + ");
    poVar7 = std::operator<<(poVar7,(string *)&idx);
    std::operator<<(poVar7," + 0, 3*sizeof(double));\n");
  }
  std::__cxx11::string::~string((string *)&local_1c8);
  std::__cxx11::string::~string((string *)&local_1a0);
  poVar7 = (this->super_OSTEI_Writer_Base).os_;
  if ((char)local_1a4 == '\0') {
    poVar7 = std::operator<<(poVar7,(string *)&indent3_abi_cxx11_);
    poVar7 = std::operator<<(poVar7,"memcpy(buffer + idx + 6, ");
    std::__cxx11::string::string((string *)&local_1a0,"",&local_1d1);
    ArrVarName(&local_1c8,(QAM *)local_178,&local_1a0);
    poVar7 = std::operator<<(poVar7,(string *)&local_1c8);
    poVar7 = std::operator<<(poVar7," + ");
    poVar7 = std::operator<<(poVar7,(string *)&idx);
    std::operator<<(poVar7," + 6, 6*sizeof(double));\n");
  }
  else {
    poVar7 = std::operator<<(poVar7,(string *)&indent3_abi_cxx11_);
    poVar7 = std::operator<<(poVar7,"memcpy(buffer + idx + 6, ");
    std::__cxx11::string::string((string *)&local_1a0,"",&local_1d1);
    ArrVarName(&local_1c8,(QAM *)local_178,&local_1a0);
    poVar7 = std::operator<<(poVar7,(string *)&local_1c8);
    poVar7 = std::operator<<(poVar7," + ");
    poVar7 = std::operator<<(poVar7,(string *)&idx);
    std::operator<<(poVar7," + 9, 3*sizeof(double));\n");
    std::__cxx11::string::~string((string *)&local_1c8);
    std::__cxx11::string::~string((string *)&local_1a0);
    poVar7 = std::operator<<((this->super_OSTEI_Writer_Base).os_,(string *)&indent3_abi_cxx11_);
    poVar7 = std::operator<<(poVar7,"memcpy(buffer + idx + 9, ");
    std::__cxx11::string::string((string *)&local_1a0,"",&local_1d1);
    ArrVarName(&local_1c8,(QAM *)local_178,&local_1a0);
    poVar7 = std::operator<<(poVar7,(string *)&local_1c8);
    poVar7 = std::operator<<(poVar7," + ");
    poVar7 = std::operator<<(poVar7,(string *)&idx);
    std::operator<<(poVar7," + 6, 3*sizeof(double));\n");
  }
  std::__cxx11::string::~string((string *)&local_1c8);
  std::__cxx11::string::~string((string *)&local_1a0);
  poVar7 = std::operator<<((this->super_OSTEI_Writer_Base).os_,(string *)&indent3_abi_cxx11_);
  std::operator<<(poVar7,"idx += 12;\n");
  poVar7 = std::operator<<((this->super_OSTEI_Writer_Base).os_,(string *)&indent2_abi_cxx11_);
  std::operator<<(poVar7,"}\n");
  std::operator<<((this->super_OSTEI_Writer_Base).os_,"\n");
  poVar7 = std::operator<<((this->super_OSTEI_Writer_Base).os_,(string *)&indent2_abi_cxx11_);
  poVar7 = std::operator<<(poVar7,"memcpy(");
  std::__cxx11::string::string((string *)&local_1a0,"",&local_1d1);
  ArrVarName(&local_1c8,(QAM *)local_178,&local_1a0);
  poVar7 = std::operator<<(poVar7,(string *)&local_1c8);
  poVar7 = std::operator<<(poVar7,"+q*12*");
  poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
  poVar7 = std::operator<<(poVar7,", buffer, 12*");
  poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
  std::operator<<(poVar7,"*sizeof(double));\n");
  std::__cxx11::string::~string((string *)&local_1c8);
  std::__cxx11::string::~string((string *)&local_1a0);
  poVar7 = std::operator<<((this->super_OSTEI_Writer_Base).os_,(string *)&indent1_abi_cxx11_);
  std::operator<<(poVar7,"}\n");
  std::operator<<((this->super_OSTEI_Writer_Base).os_,"\n");
  poVar7 = std::operator<<((this->super_OSTEI_Writer_Base).os_,(string *)&indent1_abi_cxx11_);
  std::operator<<(poVar7,"return ret;\n");
  std::operator<<((this->super_OSTEI_Writer_Base).os_,"}\n");
  std::operator<<((this->super_OSTEI_Writer_Base).os_,"\n");
  poVar7 = (this->super_OSTEI_Writer_Base).osh_;
  pQVar9 = (QAM *)local_178;
  QAM::QAM((QAM *)local_f0,pQVar9);
  FunctionPrototype__abi_cxx11_(&local_1c8,(OSTEIDeriv1_Writer *)pQVar9,(QAM *)local_f0);
  poVar7 = std::operator<<(poVar7,(string *)&local_1c8);
  std::operator<<(poVar7,";\n\n");
  std::__cxx11::string::~string((string *)&local_1c8);
  std::__cxx11::string::~string((string *)(local_f0 + 0x10));
  std::__cxx11::string::~string((string *)&idx);
  std::__cxx11::string::~string((string *)&fname);
LAB_00126efd:
  std::__cxx11::string::~string((string *)(local_178 + 0x10));
  return;
}

Assistant:

void OSTEIDeriv1_Writer::Write_Permute_(QAM am, bool swap12, bool swap34) const
{
    QAM permuted = am;
    if(swap12)
        std::swap(permuted[0], permuted[1]);
    if(swap34)
        std::swap(permuted[2], permuted[3]);

    // is this permutation unique?
    if(swap34 && !swap12 && permuted[2] == permuted[3])
        return;
    if(swap12 && !swap34 && permuted[0] == permuted[1])
        return;
    if(swap12 && swap34 && (permuted[0] == permuted[1] || permuted[2] == permuted[3]))
        return;

    // output of the function starts here
    os_ << FunctionPrototype_(permuted) << "\n";
    os_ << "{\n";

    const char * P_var = "P";
    const char * Q_var = "Q";

    if(swap12)
    {
        P_var = "P_tmp";
        os_ << indent1 << "double P_AB[3*P.nshell12];\n";
    	os_ << indent1 << "struct simint_multi_shellpair P_tmp = P;\n";
        os_ << indent1 << "P_tmp.alpha2 = P.beta2;  P_tmp.beta2 = P.alpha2;\n";
        os_ << indent1 << "P_tmp.PA_x = P.PB_x;  P_tmp.PA_y = P.PB_y;  P_tmp.PA_z = P.PB_z;\n";
        os_ << indent1 << "P_tmp.PB_x = P.PA_x;  P_tmp.PB_y = P.PA_y;  P_tmp.PB_z = P.PA_z;\n";
        os_ << indent1 << "P_tmp.AB_x = P_AB;\n";
        os_ << indent1 << "P_tmp.AB_y = P_AB + P.nshell12;\n";
        os_ << indent1 << "P_tmp.AB_z = P_AB + 2*P.nshell12;\n";
        os_ << "\n";
        os_ << indent1 << "for(int i = 0; i < P.nshell12; i++)\n";
        os_ << indent1 << "{\n";
        os_ << indent2 << "P_tmp.AB_x[i] = -P.AB_x[i];\n";
        os_ << indent2 << "P_tmp.AB_y[i] = -P.AB_y[i];\n";
        os_ << indent2 << "P_tmp.AB_z[i] = -P.AB_z[i];\n";
        os_ << indent1 << "}\n\n";
    }

    if(swap34)
    {
	    Q_var = "Q_tmp";
        os_ << indent1 << "double Q_AB[3*Q.nshell12];\n";
    	os_ << indent1 << "struct simint_multi_shellpair Q_tmp = Q;\n";
        os_ << indent1 << "Q_tmp.alpha2 = Q.beta2;  Q_tmp.beta2 = Q.alpha2;\n";
		os_ << indent1 << "Q_tmp.PA_x = Q.PB_x;  Q_tmp.PA_y = Q.PB_y;  Q_tmp.PA_z = Q.PB_z;\n";
        os_ << indent1 << "Q_tmp.PB_x = Q.PA_x;  Q_tmp.PB_y = Q.PA_y;  Q_tmp.PB_z = Q.PA_z;\n";
        os_ << indent1 << "Q_tmp.AB_x = Q_AB;\n";
        os_ << indent1 << "Q_tmp.AB_y = Q_AB + Q.nshell12;\n";
        os_ << indent1 << "Q_tmp.AB_z = Q_AB + 2*Q.nshell12;\n";
        os_ << "\n";
        os_ << indent1 << "for(int i = 0; i < Q.nshell12; i++)\n";
        os_ << indent1 << "{\n";
        os_ << indent2 << "Q_tmp.AB_x[i] = -Q.AB_x[i];\n";
        os_ << indent2 << "Q_tmp.AB_y[i] = -Q.AB_y[i];\n";
        os_ << indent2 << "Q_tmp.AB_z[i] = -Q.AB_z[i];\n";
        os_ << indent1 << "}\n\n";
    }

    std::string fname = FunctionName_(am);
    os_ << indent1 << "int ret = " << fname
        << "(" << P_var << ", " << Q_var << ", screen_tol, "
        << "work, " << ArrVarName(permuted) << ");\n";


    size_t ncart_abcd = NCART(am);
    //size_t ncart_a  = NCART(am[0]);
    size_t ncart_b  = NCART(am[1]);
    size_t ncart_c  = NCART(am[2]);
    size_t ncart_d  = NCART(am[3]);
    size_t ncart_a2 = NCART(permuted[0]);
    size_t ncart_b2 = NCART(permuted[1]);
    size_t ncart_c2 = NCART(permuted[2]);
    size_t ncart_d2 = NCART(permuted[3]);

    size_t ncart_bcd = ncart_b * ncart_c * ncart_d;
    size_t ncart_cd = ncart_c * ncart_d;

    char va = 'a';
    char vb = 'b';
    char vc = 'c';
    char vd = 'd';

    if(swap12)
        std::swap(va, vb);
    if(swap34)
        std::swap(vc, vd);

    std::string idx = StringBuilder("12*(q*", ncart_abcd,
                                    "+", va, "*", ncart_bcd,
                                    "+", vb, "*", ncart_cd,
                                    "+", vc, "*", ncart_d, "+", vd, ")");

    os_ << indent1 << "double buffer[12*" << ncart_abcd << "] SIMINT_ALIGN_ARRAY_DBL;\n\n";


    os_ << indent1 << "for(int q = 0; q < ret; q++)\n";
    os_ << indent1 << "{\n";
    os_ << indent2 << "int idx = 0;\n";
    os_ << indent2 << "for(int a = 0; a < " << ncart_a2 << "; ++a)\n";
    os_ << indent2 << "for(int b = 0; b < " << ncart_b2 << "; ++b)\n";
    os_ << indent2 << "for(int c = 0; c < " << ncart_c2 << "; ++c)\n";
    os_ << indent2 << "for(int d = 0; d < " << ncart_d2 << "; ++d)\n";
    os_ << indent2 << "{\n";
    if(swap12)
    {
        os_ << indent3 << "memcpy(buffer + idx + 0, " << ArrVarName(permuted) << " + " << idx << " + 3, 3*sizeof(double));\n";
        os_ << indent3 << "memcpy(buffer + idx + 3, " << ArrVarName(permuted) << " + " << idx << " + 0, 3*sizeof(double));\n";
    }
    else
        os_ << indent3 << "memcpy(buffer + idx + 0, " << ArrVarName(permuted) << " + " << idx << " + 0, 6*sizeof(double));\n";

    if(swap34)
    {
        os_ << indent3 << "memcpy(buffer + idx + 6, " << ArrVarName(permuted) << " + " << idx << " + 9, 3*sizeof(double));\n";
        os_ << indent3 << "memcpy(buffer + idx + 9, " << ArrVarName(permuted) << " + " << idx << " + 6, 3*sizeof(double));\n";
    }
    else
        os_ << indent3 << "memcpy(buffer + idx + 6, " << ArrVarName(permuted) << " + " << idx << " + 6, 6*sizeof(double));\n";

    os_ << indent3 << "idx += 12;\n";
    os_ << indent2 << "}\n";
    os_ << "\n";
        os_ << indent2 << "memcpy(" << ArrVarName(permuted) << "+q*12*" << ncart_abcd
                       << ", buffer, 12*" << ncart_abcd << "*sizeof(double));\n";
    os_ << indent1 << "}\n";

    os_ << "\n";
    os_ << indent1 << "return ret;\n";
    os_ << "}\n";
    os_ << "\n";

    osh_ << FunctionPrototype_(permuted) << ";\n\n";
}